

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCDPP_MPI.h
# Opt level: O2

value_type_conflict1 __thiscall
CCDPP_MPI::predict(CCDPP_MPI *this,vector<Rating,_std::allocator<Rating>_> *ratings)

{
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  *this_00;
  ulong uVar1;
  int iVar2;
  int workload;
  int size;
  value_type_conflict1 global_rmse;
  value_type_conflict1 local_a0;
  vector<double,_std::allocator<double>_> rmses;
  value_type_conflict1 result;
  _Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_MPI_h:184:45)_(int)>
  local_60;
  
  iVar2 = this->Q_workload * this->parameter->k;
  MPI_Allgather(this->Q,iVar2,&ompi_mpi_double,this->entire_Q,iVar2,&ompi_mpi_double,
                &ompi_mpi_comm_world);
  iVar2 = this->P_workload * this->parameter->k;
  MPI_Allgather(this->P,iVar2,&ompi_mpi_double,this->entire_P,iVar2,&ompi_mpi_double,
                &ompi_mpi_comm_world);
  uVar1 = ((long)(ratings->super__Vector_base<Rating,_std::allocator<Rating>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(ratings->super__Vector_base<Rating,_std::allocator<Rating>_>)._M_impl.
                super__Vector_impl_data._M_start) / 0x18;
  size = (int)uVar1;
  iVar2 = this->parameter->num_of_thread;
  uVar1 = (ulong)(uint)(size >> 0x1f) << 0x20 | uVar1 & 0xffffffff;
  workload = ((int)((long)uVar1 / (long)iVar2) + 1) - (uint)((int)((long)uVar1 % (long)iVar2) == 0);
  result = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&rmses,(long)iVar2,&result,(allocator_type *)&global_rmse);
  for (iVar2 = 0; this_00 = this->thread_pool, iVar2 < this->parameter->num_of_thread;
      iVar2 = iVar2 + 1) {
    local_60._M_f.workload = &workload;
    local_60._M_f.size = &size;
    local_60._M_f.rmses = &rmses;
    local_60._M_f.ratings = ratings;
    local_60._M_f.this = this;
    local_60._M_bound_args.super__Tuple_impl<0UL,_int>.super__Head_base<0UL,_int,_false>.
    _M_head_impl = (_Tuple_impl<0UL,_int>)(_Tuple_impl<0UL,_int>)iVar2;
    boost::function0<void>::
    function0<std::_Bind<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Hui_Li[P]CCDPP_alg_CCDPP_MPI_h:184:45)_(int)>_>
              ((function0<void> *)&result,&local_60,0);
    boost::threadpool::
    thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
    ::schedule(this_00,(function0<void> *)&result);
    boost::function0<void>::~function0((function0<void> *)&result);
  }
  boost::threadpool::
  thread_pool<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
  ::wait(this_00,(void *)0x0);
  result = 0.0;
  for (; rmses.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         rmses.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
      rmses.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = rmses.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 1) {
    result = result + *rmses.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
  }
  MPI_Allreduce(&result,&global_rmse,1,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
  local_a0 = global_rmse;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&rmses.super__Vector_base<double,_std::allocator<double>_>);
  return local_a0;
}

Assistant:

value_type predict(vector<Rating> &ratings) {

        // For prediction, you need Q and P, thus Q and P needs to be communicated.
        MPI_Allgather(Q, parameter->k * Q_workload, VALUE_MPI_TYPE, entire_Q, parameter->k * Q_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);
        MPI_Allgather(P, parameter->k * P_workload, VALUE_MPI_TYPE, entire_P, parameter->k * P_workload, VALUE_MPI_TYPE, MPI_COMM_WORLD);

        int size = ratings.size();
        int workload = size / parameter->num_of_thread + ((size % parameter->num_of_thread == 0) ? 0 : 1);

        vector<value_type> rmses(parameter->num_of_thread, 0);

        for(int thread_index=0;thread_index<parameter->num_of_thread;thread_index++){
            thread_pool->schedule(std::bind([&](const int thread_index) {
                int start = workload * thread_index;
                int end = std::min(start + workload, size);

                for (int i = start; i < end; i++) {

                    Rating &rating = ratings[i];

                    value_type prediction = 0;
                    for (int d = 0; d < parameter->k; d++) {
                        prediction += entire_Q[d * Q_workload * num_of_machines + rating.user_id] * entire_P[d * P_workload * num_of_machines + rating.item_id];
                    }

                    value_type error = rating.score - prediction;
                    rmses[thread_index] += error * error;
                }
            }, thread_index));
        }

        thread_pool->wait();

        value_type result = 0;

        for (value_type rmse:rmses) {
            result += rmse;
        }

        value_type global_rmse;
        MPI_Allreduce(&result, &global_rmse, 1, VALUE_MPI_TYPE, MPI_SUM, MPI_COMM_WORLD);

        return global_rmse;
    }